

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_overload_function(sqlite3 *db,char *zName,int nArg)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  FuncDef *pFVar4;
  uint uVar5;
  
  if (zName == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0xffffffff;
    pcVar3 = zName;
    do {
      uVar5 = uVar5 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    uVar5 = uVar5 & 0x3fffffff;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  iVar2 = 0;
  pFVar4 = sqlite3FindFunction(db,zName,uVar5,nArg,'\x01','\0');
  if (pFVar4 == (FuncDef *)0x0) {
    iVar2 = sqlite3CreateFunc(db,zName,nArg,1,(void *)0x0,sqlite3InvalidFunction,
                              (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr *)0x0,(FuncDestructor *)0x0);
  }
  iVar2 = sqlite3ApiExit(db,iVar2);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_overload_function(
  sqlite3 *db,
  const char *zName,
  int nArg
){
  int nName = sqlite3Strlen30(zName);
  int rc = SQLITE_OK;
  sqlite3_mutex_enter(db->mutex);
  if( sqlite3FindFunction(db, zName, nName, nArg, SQLITE_UTF8, 0)==0 ){
    rc = sqlite3CreateFunc(db, zName, nArg, SQLITE_UTF8,
                           0, sqlite3InvalidFunction, 0, 0, 0);
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}